

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O0

void __thiscall
ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
          (ON_OBSOLETE_V5_Annotation *this,ON_OBSOLETE_V2_Annotation *V2_annotation,
          ON_3dmAnnotationContext *annotation_context)

{
  bool bVar1;
  int iVar2;
  wchar_t *text_value;
  ON_2dPoint *pOVar3;
  ON_2dVector OVar4;
  ON_2dPoint OVar5;
  ON_wString *local_128;
  int local_114;
  int local_110;
  int max_point_count;
  int min_point_count;
  bool bUserPositionedText;
  V5_TextDisplayMode text_display_mode;
  double dStack_100;
  double local_f8;
  ON_Plane local_f0;
  undefined1 local_70 [8];
  ON_2dPoint v5_point;
  ON_2dPoint V2_point;
  undefined1 auStack_48 [4];
  int i;
  ON_2dVector v;
  int V2_point_count;
  ON_wString local_28;
  ON_wString text;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_OBSOLETE_V2_Annotation *V2_annotation_local;
  ON_OBSOLETE_V5_Annotation *this_local;
  
  text.m_s = (wchar_t *)annotation_context;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    text.m_s = (wchar_t *)&ON_3dmAnnotationContext::Default;
  }
  SetTextFormula(this,(wchar_t *)0x0);
  bVar1 = ON_wString::IsNotEmpty(&V2_annotation->m_usertext);
  if (bVar1) {
    local_128 = &V2_annotation->m_usertext;
  }
  else {
    local_128 = &V2_annotation->m_defaulttext;
  }
  ON_wString::ON_wString(&local_28,local_128);
  ON_wString::TrimLeftAndRight(&local_28,(wchar_t *)0x0);
  text_value = ON_wString::operator_cast_to_wchar_t_(&local_28);
  SetTextValue(this,text_value);
  v.y._0_4_ = ON_OBSOLETE_V2_Annotation::PointCount(V2_annotation);
  if (0 < v.y._0_4_) {
    pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[](&V2_annotation->m_points,0);
    bVar1 = ON_2dPoint::IsValid(pOVar3);
    if ((bVar1) && (V2_annotation->m_type != dtDimAngular)) {
      pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[](&V2_annotation->m_points,0);
      OVar4 = ON_2dPoint::operator-(&ON_2dPoint::Origin,pOVar3);
      goto LAB_0068bb9b;
    }
  }
  OVar4.y = ON_2dVector::ZeroVector.y;
  OVar4.x = ON_2dVector::ZeroVector.x;
LAB_0068bb9b:
  v.x = OVar4.y;
  _auStack_48 = OVar4.x;
  ON_SimpleArray<ON_2dPoint>::SetCount(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,0);
  ON_SimpleArray<ON_2dPoint>::Reserve
            (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,(long)v.y._0_4_);
  if (0 < v.y._0_4_) {
    ON_SimpleArray<ON_2dPoint>::Append
              (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,&ON_2dPoint::Origin);
  }
  for (V2_point.y._4_4_ = 1; V2_point.y._4_4_ < v.y._0_4_; V2_point.y._4_4_ = V2_point.y._4_4_ + 1)
  {
    OVar5 = ON_OBSOLETE_V2_Annotation::Point(V2_annotation,V2_point.y._4_4_);
    v5_point.y = OVar5.x;
    bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)&v5_point.y);
    if (bVar1) {
      OVar5 = ON_2dPoint::operator+((ON_2dPoint *)&v5_point.y,(ON_2dVector *)auStack_48);
    }
    else {
      OVar5.y = OVar5.y;
      OVar5.x = v5_point.y;
    }
    v5_point.x = OVar5.y;
    local_70 = (undefined1  [8])OVar5.x;
    SetPoint(this,V2_point.y._4_4_,(ON_2dPoint *)local_70);
  }
  ON_OBSOLETE_V2_Annotation::Plane(&local_f0,V2_annotation);
  (this->m_plane).plane_equation.z = local_f0.plane_equation.z;
  (this->m_plane).plane_equation.d = local_f0.plane_equation.d;
  (this->m_plane).plane_equation.x = local_f0.plane_equation.x;
  (this->m_plane).plane_equation.y = local_f0.plane_equation.y;
  (this->m_plane).zaxis.y = local_f0.zaxis.y;
  (this->m_plane).zaxis.z = local_f0.zaxis.z;
  (this->m_plane).yaxis.z = local_f0.yaxis.z;
  (this->m_plane).zaxis.x = local_f0.zaxis.x;
  (this->m_plane).yaxis.x = local_f0.yaxis.x;
  (this->m_plane).yaxis.y = local_f0.yaxis.y;
  (this->m_plane).xaxis.y = local_f0.xaxis.y;
  (this->m_plane).xaxis.z = local_f0.xaxis.z;
  (this->m_plane).origin.z = local_f0.origin.z;
  (this->m_plane).xaxis.x = local_f0.xaxis.x;
  (this->m_plane).origin.x = local_f0.origin.x;
  (this->m_plane).origin.y = local_f0.origin.y;
  ON_Plane::~ON_Plane(&local_f0);
  ON_Plane::UpdateEquation(&this->m_plane);
  bVar1 = ON_Plane::IsValid(&this->m_plane);
  if (bVar1) {
    bVar1 = ON_2dVector::IsNotZero((ON_2dVector *)auStack_48);
    if (bVar1) {
      ON_Plane::PointAt((ON_3dPoint *)&min_point_count,&this->m_plane,-_auStack_48,-v.x);
      (this->m_plane).origin.z = local_f8;
      (this->m_plane).origin.x = _min_point_count;
      (this->m_plane).origin.y = dStack_100;
      ON_Plane::UpdateEquation(&this->m_plane);
    }
  }
  else {
    memcpy(&this->m_plane,&ON_Plane::World_xy,0x80);
  }
  this->m_textheight = 1.0;
  max_point_count._3_1_ = kNormal;
  max_point_count._2_1_ = false;
  local_110 = -1;
  local_114 = -1;
  switch(V2_annotation->m_type) {
  case dtNothing:
    this->m_textdisplaymode = kNormal;
    break;
  case dtDimLinear:
  case dtDimAligned:
    max_point_count._3_1_ = kAboveLine;
    local_110 = 5;
    local_114 = 5;
    break;
  case dtDimAngular:
    bVar1 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    max_point_count._2_1_ = (bool)(-bVar1 & 1);
    max_point_count._3_1_ = kAboveLine;
    local_110 = 2;
    local_114 = 3;
    break;
  case dtDimDiameter:
    bVar1 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    max_point_count._2_1_ = (bool)(-bVar1 & 1);
    break;
  case dtDimRadius:
    bVar1 = ON_OBSOLETE_V2_Annotation::UserPositionedText(V2_annotation);
    max_point_count._2_1_ = (bool)(-bVar1 & 1);
    break;
  case dtLeader:
    max_point_count._2_1_ = false;
    max_point_count._3_1_ = kInLine;
    local_110 = 2;
    break;
  case dtTextBlock:
    break;
  case dtDimOrdinate:
    break;
  default:
    this->m_textdisplaymode = kNormal;
  }
  this->m_textdisplaymode = max_point_count._3_1_;
  this->m_userpositionedtext = max_point_count._2_1_;
  if (((local_114 < 1) || (local_114 < local_110)) ||
     (iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>),
     iVar2 <= local_114)) {
    if ((-1 < local_110) &&
       (iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                          (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>), iVar2 < local_110))
    {
      ON_SimpleArray<ON_2dPoint>::SetCount(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,0);
    }
  }
  else {
    ON_SimpleArray<ON_2dPoint>::SetCount
              (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,local_114);
  }
  iVar2 = ON_3dmAnnotationContext::V5_ArchiveDimStyleIndex((ON_3dmAnnotationContext *)text.m_s);
  SetV5_3dmArchiveDimStyleIndex(this,iVar2);
  ON_wString::~ON_wString(&local_28);
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation(
  const class ON_OBSOLETE_V2_Annotation& V2_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  //const ON_3dmAnnotationSettings& annotation_settings = annotation_context->AnnotationSettings();

  SetTextFormula(nullptr);

  ON_wString text
    = (V2_annotation.m_usertext.IsNotEmpty())
    ? V2_annotation.m_usertext
    : V2_annotation.m_defaulttext;
  text.TrimLeftAndRight();

  SetTextValue(text);

  // 30 Oct 2013 - Lowell - changed to copy the number of points in V2_annotation.PointCount() instead of always 5
  const int V2_point_count = V2_annotation.PointCount();
  const ON_2dVector v
    = (V2_point_count > 0 && V2_annotation.m_points[0].IsValid() && ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular != V2_annotation.m_type)
    ? (ON_2dPoint::Origin - V2_annotation.m_points[0])
    : ON_2dVector::ZeroVector;

  m_points.SetCount(0);
  m_points.Reserve(V2_point_count);
  if (V2_point_count > 0)
    m_points.Append(ON_2dPoint::Origin);
  for (int i = 1; i < V2_point_count; i++)
  {
    const ON_2dPoint V2_point = V2_annotation.Point(i);
    ON_2dPoint v5_point
      = V2_point.IsValid()
      ? V2_point + v
      : V2_point;
    SetPoint(i, v5_point);
  }

  m_plane = V2_annotation.Plane();
  m_plane.UpdateEquation();
  if (false == m_plane.IsValid())
    m_plane = ON_Plane::World_xy;
  else if (v.IsNotZero())
  {
    m_plane.origin = m_plane.PointAt(-v.x, -v.y);
    m_plane.UpdateEquation();
  }

  m_textheight = 1.0;

  ON_INTERNAL_OBSOLETE::V5_TextDisplayMode text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
  bool bUserPositionedText = false;
  int min_point_count = -1;
  int max_point_count = -1;

  switch (V2_annotation.m_type)
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    max_point_count = ON_OBSOLETE_V5_DimLinear::dim_pt_count;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
    min_point_count = 2;
    max_point_count = 3;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    bUserPositionedText = V2_annotation.UserPositionedText() ? true : false;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
    bUserPositionedText = false;
    text_display_mode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kInLine;
    min_point_count = 2;
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
    break;

  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    break;

  default:
    m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kNormal;
    break;
  }

  m_textdisplaymode = text_display_mode;
  m_userpositionedtext = bUserPositionedText;

  if (max_point_count > 0 && max_point_count >= min_point_count && m_points.Count() > max_point_count)
    m_points.SetCount(max_point_count);
  else if (min_point_count >= 0 && m_points.Count() < min_point_count)
    m_points.SetCount(0);

  SetV5_3dmArchiveDimStyleIndex(annotation_context->V5_ArchiveDimStyleIndex());
}